

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O3

void cupdlp_diffTwoNorm(CUPDLPwork *w,cupdlp_float *x,cupdlp_float *y,cupdlp_int len,
                       cupdlp_float *res)

{
  cupdlp_float *pcVar1;
  ulong uVar2;
  double nrm;
  double __x;
  cupdlp_float cVar3;
  
  memcpy(w->buffer2,x,(long)len * 8);
  __x = 0.0;
  if (0 < len) {
    pcVar1 = w->buffer2;
    uVar2 = 0;
    do {
      pcVar1[uVar2] = pcVar1[uVar2] - y[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
    __x = 0.0;
    uVar2 = 0;
    do {
      __x = __x + pcVar1[uVar2] * pcVar1[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)len != uVar2);
  }
  if (__x < 0.0) {
    cVar3 = sqrt(__x);
  }
  else {
    cVar3 = SQRT(__x);
  }
  *res = cVar3;
  return;
}

Assistant:

void cupdlp_diffTwoNorm(CUPDLPwork *w, const cupdlp_float *x,
                        const cupdlp_float *y, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, y, w->buffer2);
  cupdlp_twoNorm(w, len, w->buffer2, res);
}